

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toolbar.cpp
# Opt level: O0

void __thiscall QtMWidgets::ToolBar::ToolBar(ToolBar *this,QWidget *parent)

{
  ToolBarPrivate *pTVar1;
  ToolBarPrivate *this_00;
  undefined1 local_60 [16];
  undefined8 uStack_50;
  code *local_48;
  undefined8 local_40;
  undefined1 local_38 [28];
  QFlags<Qt::WindowType> local_1c;
  QWidget *local_18;
  QWidget *parent_local;
  ToolBar *this_local;
  
  local_18 = parent;
  parent_local = &this->super_QWidget;
  QFlags<Qt::WindowType>::QFlags(&local_1c);
  QWidget::QWidget(&this->super_QWidget,parent,(QFlags_conflict1 *)(ulong)local_1c.i);
  *(undefined ***)this = &PTR_metaObject_00237b88;
  *(undefined ***)&this->field_0x10 = &PTR__ToolBar_00237d38;
  pTVar1 = (ToolBarPrivate *)operator_new(0x28);
  ToolBarPrivate::ToolBarPrivate(pTVar1,this);
  QScopedPointer<QtMWidgets::ToolBarPrivate,_QScopedPointerDeleter<QtMWidgets::ToolBarPrivate>_>::
  QScopedPointer(&this->d,pTVar1);
  this_00 = QScopedPointer<QtMWidgets::ToolBarPrivate,_QScopedPointerDeleter<QtMWidgets::ToolBarPrivate>_>
            ::operator->(&this->d);
  ToolBarPrivate::init(this_00,(EVP_PKEY_CTX *)pTVar1);
  pTVar1 = QScopedPointer<QtMWidgets::ToolBarPrivate,_QScopedPointerDeleter<QtMWidgets::ToolBarPrivate>_>
           ::operator->(&this->d);
  local_48 = NavigationArrow::clicked;
  local_40 = 0;
  local_60._8_8_ = _q_leftArrowClicked;
  uStack_50 = 0;
  QObject::connect<void(QtMWidgets::NavigationArrow::*)(),void(QtMWidgets::ToolBar::*)()>
            ((Object *)local_38,(offset_in_NavigationArrow_to_subr)pTVar1->left,
             (Object *)NavigationArrow::clicked,0,(ConnectionType)this);
  QMetaObject::Connection::~Connection((Connection *)local_38);
  pTVar1 = QScopedPointer<QtMWidgets::ToolBarPrivate,_QScopedPointerDeleter<QtMWidgets::ToolBarPrivate>_>
           ::operator->(&this->d);
  QObject::connect<void(QtMWidgets::NavigationArrow::*)(),void(QtMWidgets::ToolBar::*)()>
            ((Object *)local_60,(offset_in_NavigationArrow_to_subr)pTVar1->right,
             (Object *)NavigationArrow::clicked,0,(ConnectionType)this);
  QMetaObject::Connection::~Connection((Connection *)local_60);
  return;
}

Assistant:

ToolBar::ToolBar( QWidget * parent )
	:	QWidget( parent )
	,	d( new ToolBarPrivate( this ) )
{
	d->init();

	connect( d->left, &NavigationArrow::clicked,
		this, &ToolBar::_q_leftArrowClicked );

	connect( d->right, &NavigationArrow::clicked,
		this, &ToolBar::_q_rightArrowClicked );
}